

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O1

void mjs::run_test_spec(string_view *source_text,string_view *name)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  size_t __n;
  size_type __pos;
  pointer pcVar2;
  size_t __val;
  runtime_error *prVar3;
  long *plVar4;
  wostream *pwVar5;
  pointer pwVar6;
  size_type *psVar7;
  undefined1 *__pos_00;
  string_view sVar8;
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> bs;
  vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> specs;
  char delim [4];
  shared_ptr<mjs::source_file> file;
  wostringstream oss;
  gc_heap heap;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  block_statement *local_320;
  vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> local_318;
  string_view *local_2f8;
  char local_2ec [4];
  shared_ptr<mjs::source_file> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [16];
  undefined1 local_268 [360];
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  gc_heap local_a0;
  
  builtin_strncpy(local_2ec,"//$",4);
  gc_heap::gc_heap(&local_a0,0x100000);
  local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278._0_8_ = (element_type *)local_268;
  std::__cxx11::wstring::_M_construct<char_const*>
            ((wstring *)local_278,name->_M_str,name->_M_str + name->_M_len);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::wstring::_M_construct<char_const*>
            ((wstring *)&local_360,source_text->_M_str,source_text->_M_str + source_text->_M_len);
  local_340._M_dataplus._M_p._0_4_ = tested_version();
  local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mjs::source_file,std::allocator<mjs::source_file>,std::__cxx11::wstring,std::__cxx11::wstring,mjs::version>
            (&local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(source_file **)&local_2e8,(allocator<mjs::source_file> *)&local_298,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_278
             ,&local_360,(version *)&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity * 4 + 4);
  }
  local_2f8 = name;
  if ((element_type *)local_278._0_8_ != (element_type *)local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ * 4 + 4);
  }
  if (source_text->_M_len != 0) {
    __pos_00 = (undefined1 *)0x0;
    do {
      __n = strlen(local_2ec);
      __pos = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (source_text,local_2ec,(size_type)__pos_00,__n);
      if (__pos != 0xffffffffffffffff) {
        name = (string_view *)
               std::basic_string_view<char,_std::char_traits<char>_>::find(source_text,"\n",__pos,1)
        ;
        this._M_pi = local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        if (name == (string_view *)0xffffffffffffffff) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_340,local_2f8->_M_str,local_2f8->_M_str + local_2f8->_M_len);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_360,"Invalid test spec.",&local_340);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_360);
          local_278._0_8_ = *plVar4;
          pwVar6 = (pointer)(plVar4 + 2);
          if ((pointer)local_278._0_8_ == pwVar6) {
            local_268._0_8_ = *(undefined8 *)pwVar6;
            local_268._8_8_ = plVar4[3];
            local_278._0_8_ = local_268;
          }
          else {
            local_268._0_8_ = *(undefined8 *)pwVar6;
          }
          local_278._8_8_ = plVar4[1];
          *plVar4 = (long)pwVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::runtime_error::runtime_error(prVar3,(string *)local_278);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_278._0_8_ =
             local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_278._8_8_ =
             local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        uVar1 = __pos + 3;
        local_268._0_8_ = (long)name << 0x20 | (ulong)__pos_00 & 0xffffffff;
        local_268._8_4_ = (int)uVar1;
        pcVar2 = (pointer)(source_text->_M_len - uVar1);
        if (source_text->_M_len < uVar1) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr")
          ;
        }
        local_340._M_dataplus._M_p = (pointer)((long)name - uVar1);
        if (pcVar2 < (pointer)((long)name - uVar1)) {
          local_340._M_dataplus._M_p = pcVar2;
        }
        local_340._M_string_length = (size_type)(source_text->_M_str + uVar1);
        sVar8 = trim((string_view *)&local_340);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_360,sVar8._M_str,sVar8._M_str + sVar8._M_len);
        parse_value((value *)(local_268 + 0x10),&local_a0,(string *)&local_360);
        std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::emplace_back<mjs::test_spec>
                  (&local_318,(test_spec *)local_278);
        value::destroy((value *)(local_268 + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
        }
      }
    } while ((__pos != 0xffffffffffffffff) &&
            (__pos_00 = (undefined1 *)((long)&name->_M_len + 1),
            __pos_00 < (undefined1 *)source_text->_M_len));
  }
  if (local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,local_2f8->_M_str,local_2f8->_M_str + local_2f8->_M_len);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_360,
                   "Invalid test spec.",&local_340);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_360);
    local_278._0_8_ = *plVar4;
    pwVar6 = (pointer)(plVar4 + 2);
    if ((pointer)local_278._0_8_ == pwVar6) {
      local_268._0_8_ = *(undefined8 *)pwVar6;
      local_268._8_8_ = plVar4[3];
      local_278._0_8_ = local_268;
    }
    else {
      local_268._0_8_ = *(undefined8 *)pwVar6;
    }
    local_278._8_8_ = plVar4[1];
    *plVar4 = (long)pwVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::runtime_error::runtime_error(prVar3,(string *)local_278);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  parse((mjs *)&local_320,&local_2e8,non_strict);
  __val = test_spec_runner::run(&local_a0,&local_318,local_320);
  if (__val == ((long)local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) {
    if (local_320 != (block_statement *)0x0) {
      (*(local_320->super_statement).super_syntax_node._vptr_syntax_node[1])();
    }
    if (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2e8.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::~vector(&local_318);
    gc_heap::garbage_collect(&local_a0);
    if ((int)(((ulong)(local_a0.alloc_context_.next_free_ - local_a0.alloc_context_.start_) * 100) /
             (ulong)(local_a0.alloc_context_.capacity_ - local_a0.alloc_context_.start_)) == 0) {
      gc_heap::~gc_heap(&local_a0);
      return;
    }
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_278);
    pwVar5 = std::operator<<((wostream *)local_278,"Leaks in test spec: ");
    pwVar5 = (wostream *)
             std::wostream::operator<<
                       ((wostream *)pwVar5,
                        (int)(((ulong)(local_a0.alloc_context_.next_free_ -
                                      local_a0.alloc_context_.start_) * 100) /
                             (ulong)(local_a0.alloc_context_.capacity_ -
                                    local_a0.alloc_context_.start_)));
    pwVar5 = std::operator<<(pwVar5,"%\n");
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::wstring::_M_construct<char_const*>
              ((wstring *)&local_360,source_text->_M_str,source_text->_M_str + source_text->_M_len);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              (pwVar5,local_360._M_dataplus._M_p,local_360._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity * 4 + 4);
    }
    std::__cxx11::wstringbuf::str();
    local_340._M_dataplus._M_p = (pointer)local_360._M_string_length;
    local_340._M_string_length = (size_type)local_360._M_dataplus._M_p;
    throw_runtime_error((wstring_view *)&local_340,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                        ,0x10a);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,local_2f8->_M_str,local_2f8->_M_str + local_2f8->_M_len);
  std::operator+(&local_c0,"Invalid test spec.",&local_2b8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_2d8._M_dataplus._M_p = (pointer)*plVar4;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_2d8._M_dataplus._M_p == psVar7) {
    local_2d8.field_2._M_allocated_capacity = *psVar7;
    local_2d8.field_2._8_8_ = plVar4[3];
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar7;
  }
  local_2d8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_e0,__val);
  std::operator+(&local_298,&local_2d8,&local_e0);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_340._M_dataplus._M_p = (pointer)*plVar4;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_340._M_dataplus._M_p == psVar7) {
    local_340.field_2._M_allocated_capacity = *psVar7;
    local_340.field_2._8_8_ = plVar4[3];
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  }
  else {
    local_340.field_2._M_allocated_capacity = *psVar7;
  }
  local_340._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string
            (&local_100,
             ((long)local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_318.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_360,
                 &local_340,&local_100);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_360);
  local_278._0_8_ = *plVar4;
  pwVar6 = (pointer)(plVar4 + 2);
  if ((pointer)local_278._0_8_ == pwVar6) {
    local_268._0_8_ = *(undefined8 *)pwVar6;
    local_268._8_8_ = plVar4[3];
    local_278._0_8_ = local_268;
  }
  else {
    local_268._0_8_ = *(undefined8 *)pwVar6;
  }
  local_278._8_8_ = plVar4[1];
  *plVar4 = (long)pwVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(prVar3,(string *)local_278);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void run_test_spec(const std::string_view& source_text, const std::string_view& name) {
    constexpr const char delim[] = "//$";
    constexpr const int delim_len = sizeof(delim)-1;


    gc_heap heap{1<<20};

    {
        std::vector<test_spec> specs;
        auto file = std::make_shared<source_file>(std::wstring(name.begin(), name.end()), std::wstring(source_text.begin(), source_text.end()), tested_version());

        for (size_t pos = 0, next_pos; pos < source_text.length(); pos = next_pos + 1) {
            size_t delim_pos = source_text.find(delim, pos);
            if (delim_pos == std::string_view::npos) {
                break;
            }
            next_pos = source_text.find("\n", delim_pos);
            if (next_pos == std::string_view::npos) {
                throw std::runtime_error("Invalid test spec." + std::string(name) + ": line terminator missing.");
            }

            delim_pos += delim_len;

            source_extend extend{file, static_cast<uint32_t>(pos), static_cast<uint32_t>(next_pos)};

            specs.push_back(test_spec{extend, static_cast<uint32_t>(delim_pos), parse_value(heap, std::string(trim(source_text.substr(delim_pos, next_pos - delim_pos))))});
        }

        if (specs.empty()) {
            throw std::runtime_error("Invalid test spec." + std::string(name) + ": No specs found");
        }

        auto bs = parse(file);
        const auto index = test_spec_runner::run(heap, specs, *bs);
        if (index != specs.size()) {
            throw std::runtime_error("Invalid test spec." + std::string(name) + ": Only " + std::to_string(index) + " of " + std::to_string(specs.size()) + " specs ran");
        }
    }

    heap.garbage_collect();
    if (heap.use_percentage()) {
        std::wostringstream oss;
        oss << "Leaks in test spec: " << heap.use_percentage() << "%\n" << std::wstring(source_text.begin(), source_text.end());
        THROW_RUNTIME_ERROR(oss.str());
    }

}